

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O3

unique_ptr<MSX::Machine,_std::default_delete<MSX::Machine>_> __thiscall
MSX::Machine::MSX(Machine *this,Target *target,ROMFetcher *rom_fetcher)

{
  Model MVar1;
  Target *target_00;
  ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true> *this_00;
  
  if (target == (Target *)0x0) {
    target_00 = (Target *)0x0;
  }
  else {
    target_00 = (Target *)
                __dynamic_cast(target,&Analyser::Static::Target::typeinfo,
                               &Analyser::Static::MSX::Target::typeinfo,0);
  }
  MVar1 = target_00->model;
  if (target_00->has_msx_music == true) {
    if (MVar1 == MSX2) {
      this_00 = (ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true> *)
                operator_new(0x56d80);
      ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true>::ConcreteMachine
                (this_00,target_00,rom_fetcher);
      goto LAB_0033feae;
    }
    if (MVar1 == MSX1) {
      this_00 = (ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true> *)
                operator_new(0x2ab58);
      ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::ConcreteMachine
                ((ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true> *)this_00,target_00
                 ,rom_fetcher);
      goto LAB_0033feae;
    }
  }
  else {
    if (MVar1 == MSX2) {
      this_00 = (ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true> *)
                operator_new(0x560f0);
      ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_false>::ConcreteMachine
                ((ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_false> *)this_00,
                 target_00,rom_fetcher);
      goto LAB_0033feae;
    }
    if (MVar1 == MSX1) {
      this_00 = (ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true> *)
                operator_new(0x29ec8);
      ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false>::ConcreteMachine
                ((ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false> *)this_00,
                 target_00,rom_fetcher);
      goto LAB_0033feae;
    }
  }
  this_00 = (ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true> *)0x0;
LAB_0033feae:
  this->_vptr_Machine = (_func_int **)this_00;
  return (__uniq_ptr_data<MSX::Machine,_std::default_delete<MSX::Machine>,_true,_true>)
         (__uniq_ptr_data<MSX::Machine,_std::default_delete<MSX::Machine>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Machine> Machine::MSX(const Analyser::Static::Target *target, const ROMMachine::ROMFetcher &rom_fetcher) {
	const auto msx_target = dynamic_cast<const Target *>(target);
	if(msx_target->has_msx_music) {
		switch(msx_target->model) {
			default: 					return nullptr;
			case Target::Model::MSX1:	return std::make_unique<ConcreteMachine<Target::Model::MSX1, true>>(*msx_target, rom_fetcher);
			case Target::Model::MSX2:	return std::make_unique<ConcreteMachine<Target::Model::MSX2, true>>(*msx_target, rom_fetcher);
		}
	} else {
		switch(msx_target->model) {
			default: 					return nullptr;
			case Target::Model::MSX1:	return std::make_unique<ConcreteMachine<Target::Model::MSX1, false>>(*msx_target, rom_fetcher);
			case Target::Model::MSX2:	return std::make_unique<ConcreteMachine<Target::Model::MSX2, false>>(*msx_target, rom_fetcher);
		}
	}
}